

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall mkvmuxer::Chapters::~Chapters(Chapters *this)

{
  Chapter *pCVar1;
  Chapter *this_00;
  int iVar2;
  Chapter *chapter;
  Chapters *this_local;
  
  while (0 < this->chapters_count_) {
    iVar2 = this->chapters_count_ + -1;
    this->chapters_count_ = iVar2;
    Chapter::Clear(this->chapters_ + iVar2);
  }
  pCVar1 = this->chapters_;
  if (pCVar1 != (Chapter *)0x0) {
    this_00 = pCVar1 + *(long *)&pCVar1[-1].displays_size_;
    while (pCVar1 != this_00) {
      this_00 = this_00 + -1;
      Chapter::~Chapter(this_00);
    }
    operator_delete__(&pCVar1[-1].displays_size_);
  }
  this->chapters_ = (Chapter *)0x0;
  return;
}

Assistant:

Chapters::~Chapters() {
  while (chapters_count_ > 0) {
    Chapter& chapter = chapters_[--chapters_count_];
    chapter.Clear();
  }

  delete[] chapters_;
  chapters_ = NULL;
}